

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConvolution3DLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int value;
  int iVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  LayerUnion LVar7;
  long *plVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  undefined8 uVar11;
  WeightParams *pWVar12;
  _Alloc_hider _Var13;
  int iVar14;
  int iVar15;
  string err_7;
  Result r;
  string err;
  string local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  undefined1 local_160 [8];
  _Alloc_hider local_158;
  undefined1 local_150 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  WeightParamType local_118;
  WeightParamType local_114;
  WeightParams *local_110;
  int32 local_104;
  int32 local_100;
  int local_fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Result::Result((Result *)&local_188);
  validateInputCount((Result *)local_160,layer,1,1);
  local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160;
  std::__cxx11::string::operator=((string *)&local_180,(string *)&local_158);
  pcVar2 = local_150 + 8;
  if (local_158._M_p != pcVar2) {
    operator_delete(local_158._M_p,local_150._8_8_ + 1);
  }
  bVar4 = Result::good((Result *)&local_188);
  if (bVar4) {
    validateOutputCount((Result *)local_160,layer,1,1);
    local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160;
    std::__cxx11::string::operator=((string *)&local_180,(string *)&local_158);
    if (local_158._M_p != pcVar2) {
      operator_delete(local_158._M_p,local_150._8_8_ + 1);
    }
    bVar4 = Result::good((Result *)&local_188);
    if (bVar4) {
      if (this->ndArrayInterpretation == true) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Convolution3D","");
        validateInputOutputRankEquality((Result *)local_160,layer,&local_d0,&this->blobNameToRank);
        local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_160;
        std::__cxx11::string::operator=((string *)&local_180,(string *)&local_158);
        if (local_158._M_p != pcVar2) {
          operator_delete(local_158._M_p,local_150._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        bVar4 = Result::good((Result *)&local_188);
        if (bVar4) {
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"Convolution3D","");
          validateRankCount((Result *)local_160,layer,&local_1a8,5,-1,&this->blobNameToRank);
          local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_160;
          std::__cxx11::string::operator=((string *)&local_180,(string *)&local_158);
          if (local_158._M_p != pcVar2) {
            operator_delete(local_158._M_p,local_150._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          bVar4 = Result::good((Result *)&local_188);
          if (bVar4) goto LAB_00521018;
        }
      }
      else {
LAB_00521018:
        if (layer->_oneof_case_[0] == 0x5bf) {
          LVar7 = layer->layer_;
        }
        else {
          LVar7.convolution3d_ = Specification::Convolution3DLayerParams::default_instance();
        }
        if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ != 1) {
          std::operator+(&local_1a8,"Convolution3D layer: \'",(layer->name_).ptr_);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_1a8);
          local_160 = (undefined1  [8])local_150;
          psVar10 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_150._0_8_ = *psVar10;
            local_150._8_8_ = plVar8[3];
          }
          else {
            local_150._0_8_ = *psVar10;
            local_160 = (undefined1  [8])*plVar8;
          }
          local_158._M_p = (pointer)plVar8[1];
          *plVar8 = (long)psVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_160);
          goto LAB_00521989;
        }
        value = (LVar7.convolution_)->_stride_cached_byte_size_;
        iVar14 = (LVar7.pooling_)->type_;
        local_110 = (WeightParams *)
                    CONCAT44(local_110._4_4_,((LVar7.convolution_)->dilationfactor_).current_size_);
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"Input Channels","");
        validatePositive((Result *)local_160,iVar14,&local_1a8);
        local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_160;
        std::__cxx11::string::operator=((string *)&local_180,(string *)&local_158);
        if (local_158._M_p != local_150 + 8) {
          operator_delete(local_158._M_p,local_150._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        bVar4 = Result::good((Result *)&local_188);
        if (bVar4) {
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"Output Channels","")
          ;
          validatePositive((Result *)local_160,value,&local_1a8);
          local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_160;
          std::__cxx11::string::operator=((string *)&local_180,(string *)&local_158);
          if (local_158._M_p != local_150 + 8) {
            operator_delete(local_158._M_p,local_150._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          bVar4 = Result::good((Result *)&local_188);
          if (bVar4) {
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"Groups","");
            validatePositive((Result *)local_160,(int)local_110,&local_1a8);
            local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_160;
            std::__cxx11::string::operator=((string *)&local_180,(string *)&local_158);
            if (local_158._M_p != local_150 + 8) {
              operator_delete(local_158._M_p,local_150._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
            bVar4 = Result::good((Result *)&local_188);
            if (bVar4) {
              iVar3 = ((LVar7.convolution_)->dilationfactor_).total_size_;
              local_100 = *(int32 *)&((LVar7.convolution_)->dilationfactor_).rep_;
              local_104 = *(int32 *)((long)&((LVar7.convolution_)->dilationfactor_).rep_ + 4);
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1a8,"Kernel Depth","");
              local_fc = iVar3;
              validatePositive((Result *)local_160,iVar3,&local_1a8);
              local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_160;
              std::__cxx11::string::operator=((string *)&local_180,(string *)&local_158);
              if (local_158._M_p != local_150 + 8) {
                operator_delete(local_158._M_p,local_150._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              bVar4 = Result::good((Result *)&local_188);
              if (bVar4) {
                local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1a8,"Kernel Height","");
                validatePositive((Result *)local_160,local_100,&local_1a8);
                local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_160;
                std::__cxx11::string::operator=((string *)&local_180,(string *)&local_158);
                if (local_158._M_p != local_150 + 8) {
                  operator_delete(local_158._M_p,local_150._8_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                  operator_delete(local_1a8._M_dataplus._M_p,
                                  local_1a8.field_2._M_allocated_capacity + 1);
                }
                bVar4 = Result::good((Result *)&local_188);
                if (bVar4) {
                  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1a8,"Kernel Width","");
                  validatePositive((Result *)local_160,local_104,&local_1a8);
                  local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_160;
                  std::__cxx11::string::operator=((string *)&local_180,(string *)&local_158);
                  if (local_158._M_p != local_150 + 8) {
                    operator_delete(local_158._M_p,local_150._8_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                    operator_delete(local_1a8._M_dataplus._M_p,
                                    local_1a8.field_2._M_allocated_capacity + 1);
                  }
                  bVar4 = Result::good((Result *)&local_188);
                  if (bVar4) {
                    iVar3 = (LVar7.convolution_)->_dilationfactor_cached_byte_size_;
                    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1a8,"Stride Depth","");
                    validatePositive((Result *)local_160,iVar3,&local_1a8);
                    local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_160;
                    std::__cxx11::string::operator=((string *)&local_180,(string *)&local_158);
                    if (local_158._M_p != local_150 + 8) {
                      operator_delete(local_158._M_p,local_150._8_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                      operator_delete(local_1a8._M_dataplus._M_p,
                                      local_1a8.field_2._M_allocated_capacity + 1);
                    }
                    bVar4 = Result::good((Result *)&local_188);
                    if (bVar4) {
                      iVar3 = (LVar7.scale_)->_cached_size_;
                      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1a8,"Stride Height","");
                      validatePositive((Result *)local_160,iVar3,&local_1a8);
                      local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_160;
                      std::__cxx11::string::operator=((string *)&local_180,(string *)&local_158);
                      if (local_158._M_p != local_150 + 8) {
                        operator_delete(local_158._M_p,local_150._8_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                        operator_delete(local_1a8._M_dataplus._M_p,
                                        local_1a8.field_2._M_allocated_capacity + 1);
                      }
                      bVar4 = Result::good((Result *)&local_188);
                      if (bVar4) {
                        iVar3 = ((LVar7.convolution_)->outputshape_).current_size_;
                        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_1a8,"Stride Width","");
                        validatePositive((Result *)local_160,iVar3,&local_1a8);
                        local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_160;
                        std::__cxx11::string::operator=((string *)&local_180,(string *)&local_158);
                        if (local_158._M_p != local_150 + 8) {
                          operator_delete(local_158._M_p,local_150._8_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                          operator_delete(local_1a8._M_dataplus._M_p,
                                          local_1a8.field_2._M_allocated_capacity + 1);
                        }
                        bVar4 = Result::good((Result *)&local_188);
                        if (bVar4) {
                          iVar3 = ((LVar7.convolution_)->outputshape_).total_size_;
                          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_1a8,"Dilation Depth","");
                          validatePositive((Result *)local_160,iVar3,&local_1a8);
                          local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_160;
                          std::__cxx11::string::operator=((string *)&local_180,(string *)&local_158)
                          ;
                          if (local_158._M_p != local_150 + 8) {
                            operator_delete(local_158._M_p,local_150._8_8_ + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                            operator_delete(local_1a8._M_dataplus._M_p,
                                            local_1a8.field_2._M_allocated_capacity + 1);
                          }
                          bVar4 = Result::good((Result *)&local_188);
                          if (bVar4) {
                            iVar3 = *(int *)&((LVar7.convolution_)->outputshape_).rep_;
                            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_1a8,"Dilation Height","");
                            validatePositive((Result *)local_160,iVar3,&local_1a8);
                            local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_160;
                            std::__cxx11::string::operator=
                                      ((string *)&local_180,(string *)&local_158);
                            if (local_158._M_p != local_150 + 8) {
                              operator_delete(local_158._M_p,local_150._8_8_ + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                              operator_delete(local_1a8._M_dataplus._M_p,
                                              local_1a8.field_2._M_allocated_capacity + 1);
                            }
                            bVar4 = Result::good((Result *)&local_188);
                            if (bVar4) {
                              iVar3 = *(int32 *)((long)&((LVar7.convolution_)->outputshape_).rep_ +
                                                4);
                              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_1a8,"Dilation Width","");
                              validatePositive((Result *)local_160,iVar3,&local_1a8);
                              local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_160;
                              std::__cxx11::string::operator=
                                        ((string *)&local_180,(string *)&local_158);
                              if (local_158._M_p != local_150 + 8) {
                                operator_delete(local_158._M_p,local_150._8_8_ + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                operator_delete(local_1a8._M_dataplus._M_p,
                                                local_1a8.field_2._M_allocated_capacity + 1);
                              }
                              bVar4 = Result::good((Result *)&local_188);
                              if (bVar4) {
                                if ((LVar7.bidirectionallstm_)->_cached_size_ < 0) {
                                  std::__cxx11::to_string
                                            (&local_138,(LVar7.bidirectionallstm_)->_cached_size_);
                                  std::operator+(&local_1a8,
                                                 "Custom Padding Front must be non-negative, got \'"
                                                 ,&local_138);
                                  puVar9 = (undefined8 *)
                                           std::__cxx11::string::append((char *)&local_1a8);
                                  local_160 = (undefined1  [8])local_150;
                                  psVar10 = puVar9 + 2;
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*puVar9 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar10) {
                                    local_150._0_8_ = *psVar10;
                                    local_150._8_8_ = puVar9[3];
                                  }
                                  else {
                                    local_150._0_8_ = *psVar10;
                                    local_160 = (undefined1  [8])*puVar9;
                                  }
                                  local_158._M_p = (pointer)puVar9[1];
                                  *puVar9 = psVar10;
                                  puVar9[1] = 0;
                                  *(undefined1 *)(puVar9 + 2) = 0;
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                    operator_delete(local_1a8._M_dataplus._M_p,
                                                    local_1a8.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_138._M_dataplus._M_p != &local_138.field_2) {
                                    operator_delete(local_138._M_dataplus._M_p,
                                                    local_138.field_2._M_allocated_capacity + 1);
                                  }
                                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                                 (string *)local_160);
LAB_00521989:
                                  uVar11 = local_150._0_8_;
                                  _Var13._M_p = (pointer)local_160;
                                  if (local_160 == (undefined1  [8])local_150) goto LAB_00522634;
                                }
                                else {
                                  iVar3 = ((LVar7.slicestatic_)->strides_).total_size_;
                                  if (iVar3 < 0) {
                                    std::__cxx11::to_string(&local_138,iVar3);
                                    std::operator+(&local_1a8,
                                                                                                      
                                                  "Custom Padding Back must be non-negative, got \'"
                                                  ,&local_138);
                                    puVar9 = (undefined8 *)
                                             std::__cxx11::string::append((char *)&local_1a8);
                                    local_160 = (undefined1  [8])local_150;
                                    psVar10 = puVar9 + 2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*puVar9 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar10) {
                                      local_150._0_8_ = *psVar10;
                                      local_150._8_8_ = puVar9[3];
                                    }
                                    else {
                                      local_150._0_8_ = *psVar10;
                                      local_160 = (undefined1  [8])*puVar9;
                                    }
                                    local_158._M_p = (pointer)puVar9[1];
                                    *puVar9 = psVar10;
                                    puVar9[1] = 0;
                                    *(undefined1 *)(puVar9 + 2) = 0;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                      operator_delete(local_1a8._M_dataplus._M_p,
                                                      local_1a8.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                                      operator_delete(local_138._M_dataplus._M_p,
                                                      local_138.field_2._M_allocated_capacity + 1);
                                    }
                                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                                   (string *)local_160);
                                    goto LAB_00521989;
                                  }
                                  iVar3 = *(int *)&((LVar7.slicestatic_)->strides_).rep_;
                                  if (iVar3 < 0) {
                                    std::__cxx11::to_string(&local_138,iVar3);
                                    std::operator+(&local_1a8,
                                                   "Custom Padding Top must be non-negative, got \'"
                                                   ,&local_138);
                                    puVar9 = (undefined8 *)
                                             std::__cxx11::string::append((char *)&local_1a8);
                                    local_160 = (undefined1  [8])local_150;
                                    psVar10 = puVar9 + 2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*puVar9 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar10) {
                                      local_150._0_8_ = *psVar10;
                                      local_150._8_8_ = puVar9[3];
                                    }
                                    else {
                                      local_150._0_8_ = *psVar10;
                                      local_160 = (undefined1  [8])*puVar9;
                                    }
                                    local_158._M_p = (pointer)puVar9[1];
                                    *puVar9 = psVar10;
                                    puVar9[1] = 0;
                                    *(undefined1 *)(puVar9 + 2) = 0;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                      operator_delete(local_1a8._M_dataplus._M_p,
                                                      local_1a8.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                                      operator_delete(local_138._M_dataplus._M_p,
                                                      local_138.field_2._M_allocated_capacity + 1);
                                    }
                                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                                   (string *)local_160);
                                    goto LAB_00521989;
                                  }
                                  iVar3 = *(int32 *)((long)&((LVar7.slicestatic_)->strides_).rep_ +
                                                    4);
                                  if (iVar3 < 0) {
                                    std::__cxx11::to_string(&local_138,iVar3);
                                    std::operator+(&local_1a8,
                                                                                                      
                                                  "Custom Padding Bottom must be non-negative, got \'"
                                                  ,&local_138);
                                    puVar9 = (undefined8 *)
                                             std::__cxx11::string::append((char *)&local_1a8);
                                    local_160 = (undefined1  [8])local_150;
                                    psVar10 = puVar9 + 2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*puVar9 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar10) {
                                      local_150._0_8_ = *psVar10;
                                      local_150._8_8_ = puVar9[3];
                                    }
                                    else {
                                      local_150._0_8_ = *psVar10;
                                      local_160 = (undefined1  [8])*puVar9;
                                    }
                                    local_158._M_p = (pointer)puVar9[1];
                                    *puVar9 = psVar10;
                                    puVar9[1] = 0;
                                    *(undefined1 *)(puVar9 + 2) = 0;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                      operator_delete(local_1a8._M_dataplus._M_p,
                                                      local_1a8.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                                      operator_delete(local_138._M_dataplus._M_p,
                                                      local_138.field_2._M_allocated_capacity + 1);
                                    }
                                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                                   (string *)local_160);
                                    goto LAB_00521989;
                                  }
                                  if ((LVar7.slicestatic_)->_strides_cached_byte_size_ < 0) {
                                    std::__cxx11::to_string
                                              (&local_138,
                                               (LVar7.slicestatic_)->_strides_cached_byte_size_);
                                    std::operator+(&local_1a8,
                                                   "customPadding Left must be non-negative, got \'"
                                                   ,&local_138);
                                    puVar9 = (undefined8 *)
                                             std::__cxx11::string::append((char *)&local_1a8);
                                    local_160 = (undefined1  [8])local_150;
                                    psVar10 = puVar9 + 2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*puVar9 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar10) {
                                      local_150._0_8_ = *psVar10;
                                      local_150._8_8_ = puVar9[3];
                                    }
                                    else {
                                      local_150._0_8_ = *psVar10;
                                      local_160 = (undefined1  [8])*puVar9;
                                    }
                                    local_158._M_p = (pointer)puVar9[1];
                                    *puVar9 = psVar10;
                                    puVar9[1] = 0;
                                    *(undefined1 *)(puVar9 + 2) = 0;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                      operator_delete(local_1a8._M_dataplus._M_p,
                                                      local_1a8.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                                      operator_delete(local_138._M_dataplus._M_p,
                                                      local_138.field_2._M_allocated_capacity + 1);
                                    }
                                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                                   (string *)local_160);
                                    goto LAB_00521989;
                                  }
                                  if ((LVar7.gru_)->_cached_size_ < 0) {
                                    std::__cxx11::to_string(&local_138,(LVar7.gru_)->_cached_size_);
                                    std::operator+(&local_1a8,
                                                                                                      
                                                  "customPadding Right must be non-negative, got \'"
                                                  ,&local_138);
                                    puVar9 = (undefined8 *)
                                             std::__cxx11::string::append((char *)&local_1a8);
                                    local_160 = (undefined1  [8])local_150;
                                    psVar10 = puVar9 + 2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*puVar9 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar10) {
                                      local_150._0_8_ = *psVar10;
                                      local_150._8_8_ = puVar9[3];
                                    }
                                    else {
                                      local_150._0_8_ = *psVar10;
                                      local_160 = (undefined1  [8])*puVar9;
                                    }
                                    local_158._M_p = (pointer)puVar9[1];
                                    *puVar9 = psVar10;
                                    puVar9[1] = 0;
                                    *(undefined1 *)(puVar9 + 2) = 0;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                      operator_delete(local_1a8._M_dataplus._M_p,
                                                      local_1a8.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                                      operator_delete(local_138._M_dataplus._M_p,
                                                      local_138.field_2._M_allocated_capacity + 1);
                                    }
                                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                                   (string *)local_160);
                                    goto LAB_00521989;
                                  }
                                  pWVar12 = (LVar7.batchnorm_)->variance_;
                                  if (pWVar12 == (WeightParams *)0x0) {
                                    pWVar12 = (WeightParams *)
                                              &Specification::_WeightParams_default_instance_;
                                  }
                                  local_118 = valueType(pWVar12);
                                  pWVar12 = (LVar7.gru_)->resetgateweightmatrix_;
                                  if (pWVar12 == (WeightParams *)0x0) {
                                    pWVar12 = (WeightParams *)
                                              &Specification::_WeightParams_default_instance_;
                                  }
                                  local_114 = valueType(pWVar12);
                                  if ((local_118 == UNSPECIFIED) ||
                                     (bVar4 = (LVar7.convolution3d_)->hasbias_,
                                     (local_114 == UNSPECIFIED & bVar4) != 0)) {
                                    std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_160,"Convolution3D layer \'",
                                                  (layer->name_).ptr_);
                                    puVar9 = (undefined8 *)std::__cxx11::string::append(local_160);
                                    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                                    psVar10 = puVar9 + 2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*puVar9 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar10) {
                                      local_1a8.field_2._M_allocated_capacity = *psVar10;
                                      local_1a8.field_2._8_8_ = puVar9[3];
                                    }
                                    else {
                                      local_1a8.field_2._M_allocated_capacity = *psVar10;
                                      local_1a8._M_dataplus._M_p = (pointer)*puVar9;
                                    }
                                    local_1a8._M_string_length = puVar9[1];
                                    *puVar9 = psVar10;
                                    puVar9[1] = 0;
                                    *(undefined1 *)(puVar9 + 2) = 0;
                                    if (local_160 != (undefined1  [8])local_150) {
                                      operator_delete((void *)local_160,local_150._0_8_ + 1);
                                    }
                                    Result::Result((Result *)local_160,INVALID_MODEL_PARAMETERS,
                                                   &local_1a8);
                                    goto LAB_00521f99;
                                  }
                                  if ((bVar4 != false) &&
                                     (((local_118 == FLOAT16 && (local_114 == FLOAT32)) ||
                                      ((local_118 == FLOAT32 && (local_114 == FLOAT16)))))) {
                                    std::operator+(&local_138,"Convolution3D layer \'",
                                                   (layer->name_).ptr_);
                                    plVar8 = (long *)std::__cxx11::string::append
                                                               ((char *)&local_138);
                                    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                                    psVar10 = (size_type *)(plVar8 + 2);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*plVar8 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar10) {
                                      local_1a8.field_2._M_allocated_capacity = *psVar10;
                                      local_1a8.field_2._8_8_ = plVar8[3];
                                    }
                                    else {
                                      local_1a8.field_2._M_allocated_capacity = *psVar10;
                                      local_1a8._M_dataplus._M_p = (pointer)*plVar8;
                                    }
                                    local_1a8._M_string_length = plVar8[1];
                                    *plVar8 = (long)psVar10;
                                    plVar8[1] = 0;
                                    *(undefined1 *)(plVar8 + 2) = 0;
                                    Result::Result((Result *)local_160,INVALID_MODEL_PARAMETERS,
                                                   &local_1a8);
                                    local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_160;
                                    std::__cxx11::string::operator=
                                              ((string *)&local_180,(string *)&local_158);
                                    if (local_158._M_p != local_150 + 8) {
                                      operator_delete(local_158._M_p,local_150._8_8_ + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                      operator_delete(local_1a8._M_dataplus._M_p,
                                                      local_1a8.field_2._M_allocated_capacity + 1);
                                    }
LAB_00522188:
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                                      operator_delete(local_138._M_dataplus._M_p,
                                                      local_138.field_2._M_allocated_capacity + 1);
                                    }
                                    goto LAB_005225e6;
                                  }
                                  iVar3 = ((LVar7.convolution_)->kernelsize_).current_size_;
                                  iVar15 = iVar14;
                                  iVar6 = value;
                                  if (iVar3 != 0) {
                                    if ((LVar7.convolution3d_)->isdeconvolution_ == false) {
                                      std::operator+(&local_1a8,"Deconvolution3D Layer \'",
                                                     (layer->name_).ptr_);
                                      puVar9 = (undefined8 *)
                                               std::__cxx11::string::append((char *)&local_1a8);
                                      local_160 = (undefined1  [8])local_150;
                                      psVar10 = puVar9 + 2;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)*puVar9 ==
                                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)psVar10) {
                                        local_150._0_8_ = *psVar10;
                                        local_150._8_8_ = puVar9[3];
                                      }
                                      else {
                                        local_150._0_8_ = *psVar10;
                                        local_160 = (undefined1  [8])*puVar9;
                                      }
                                      local_158._M_p = (pointer)puVar9[1];
                                      *puVar9 = psVar10;
                                      puVar9[1] = 0;
                                      *(undefined1 *)(puVar9 + 2) = 0;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                        operator_delete(local_1a8._M_dataplus._M_p,
                                                        local_1a8.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS
                                                     ,(string *)local_160);
                                    }
                                    else {
                                      if (iVar3 == 3) {
                                        if (local_118 != QUINT) goto LAB_005221b3;
                                        goto LAB_00522047;
                                      }
                                      std::operator+(&local_1a8,"Deconvolution3D layer: \'",
                                                     (layer->name_).ptr_);
                                      puVar9 = (undefined8 *)
                                               std::__cxx11::string::append((char *)&local_1a8);
                                      local_160 = (undefined1  [8])local_150;
                                      psVar10 = puVar9 + 2;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)*puVar9 ==
                                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)psVar10) {
                                        local_150._0_8_ = *psVar10;
                                        local_150._8_8_ = puVar9[3];
                                      }
                                      else {
                                        local_150._0_8_ = *psVar10;
                                        local_160 = (undefined1  [8])*puVar9;
                                      }
                                      local_158._M_p = (pointer)puVar9[1];
                                      *puVar9 = psVar10;
                                      puVar9[1] = 0;
                                      *(undefined1 *)(puVar9 + 2) = 0;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                        operator_delete(local_1a8._M_dataplus._M_p,
                                                        local_1a8.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS
                                                     ,(string *)local_160);
                                    }
                                    goto LAB_00521989;
                                  }
                                  if (local_118 == QUINT) {
LAB_00522047:
                                    std::operator+(&local_138,"Layer \'",(layer->name_).ptr_);
                                    puVar9 = (undefined8 *)
                                             std::__cxx11::string::append((char *)&local_138);
                                    psVar10 = puVar9 + 2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*puVar9 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar10) {
                                      local_150._0_8_ = *psVar10;
                                      local_150._8_8_ = puVar9[3];
                                      local_160 = (undefined1  [8])local_150;
                                    }
                                    else {
                                      local_150._0_8_ = *psVar10;
                                      local_160 = (undefined1  [8])*puVar9;
                                    }
                                    local_158._M_p = (pointer)puVar9[1];
                                    *puVar9 = psVar10;
                                    puVar9[1] = 0;
                                    *(undefined1 *)(puVar9 + 2) = 0;
                                    puVar9 = (undefined8 *)std::__cxx11::string::append(local_160);
                                    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                                    psVar10 = puVar9 + 2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*puVar9 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar10) {
                                      local_1a8.field_2._M_allocated_capacity = *psVar10;
                                      local_1a8.field_2._8_8_ = puVar9[3];
                                    }
                                    else {
                                      local_1a8.field_2._M_allocated_capacity = *psVar10;
                                      local_1a8._M_dataplus._M_p = (pointer)*puVar9;
                                    }
                                    local_1a8._M_string_length = puVar9[1];
                                    *puVar9 = psVar10;
                                    puVar9[1] = 0;
                                    *(undefined1 *)(puVar9 + 2) = 0;
                                    if (local_160 != (undefined1  [8])local_150) {
                                      operator_delete((void *)local_160,local_150._0_8_ + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                                      operator_delete(local_138._M_dataplus._M_p,
                                                      local_138.field_2._M_allocated_capacity + 1);
                                    }
                                    Result::Result((Result *)local_160,INVALID_MODEL_PARAMETERS,
                                                   &local_1a8);
                                  }
                                  else {
                                    if ((LVar7.convolution3d_)->isdeconvolution_ == false) {
                                      iVar15 = value;
                                      iVar6 = iVar14;
                                    }
LAB_005221b3:
                                    local_118 = iVar6 / (int)local_110;
                                    local_110 = (WeightParams *)
                                                (LVar7.innerproduct_)->outputchannels_;
                                    if (local_110 == (WeightParams *)0x0) {
                                      local_110 = (WeightParams *)
                                                  &Specification::_WeightParams_default_instance_;
                                    }
                                    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_1a8,"Convolution3D ","");
                                    local_d8 = (layer->name_).ptr_;
                                    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_138,"weights","");
                                    validateGeneralWeightParams
                                              ((Result *)local_160,local_110,
                                               (long)(int)(local_100 * local_fc * local_104 *
                                                          local_118 * iVar15),(long)value,&local_1a8
                                               ,local_d8,&local_138);
                                    local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_160;
                                    std::__cxx11::string::operator=
                                              ((string *)&local_180,(string *)&local_158);
                                    if (local_158._M_p != local_150 + 8) {
                                      operator_delete(local_158._M_p,local_150._8_8_ + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                                      operator_delete(local_138._M_dataplus._M_p,
                                                      local_138.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                      operator_delete(local_1a8._M_dataplus._M_p,
                                                      local_1a8.field_2._M_allocated_capacity + 1);
                                    }
                                    bVar5 = Result::good((Result *)&local_188);
                                    if ((!bVar5) || (bVar4 == false)) goto LAB_005225e6;
                                    if (local_114 < QUINT) {
                                      pWVar12 = (LVar7.gru_)->resetgateweightmatrix_;
                                      if (pWVar12 == (WeightParams *)0x0) {
                                        pWVar12 = (WeightParams *)
                                                  &Specification::_WeightParams_default_instance_;
                                      }
                                      if (local_114 == FLOAT32) {
                                        iVar14 = (pWVar12->floatvalue_).current_size_;
                                      }
                                      else {
                                        iVar14 = (int)(((pWVar12->float16value_).ptr_)->
                                                       _M_string_length >> 1);
                                      }
                                      if (iVar14 == value) goto LAB_005225e6;
                                      std::operator+(&local_70,"Convolution3D layer \'",
                                                     (layer->name_).ptr_);
                                      plVar8 = (long *)std::__cxx11::string::append
                                                                 ((char *)&local_70);
                                      psVar10 = (size_type *)(plVar8 + 2);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)*plVar8 ==
                                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)psVar10) {
                                        local_f8.field_2._M_allocated_capacity = *psVar10;
                                        local_f8.field_2._8_8_ = plVar8[3];
                                        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                                      }
                                      else {
                                        local_f8.field_2._M_allocated_capacity = *psVar10;
                                        local_f8._M_dataplus._M_p = (pointer)*plVar8;
                                      }
                                      local_f8._M_string_length = plVar8[1];
                                      *plVar8 = (long)psVar10;
                                      plVar8[1] = 0;
                                      *(undefined1 *)(plVar8 + 2) = 0;
                                      std::__cxx11::to_string(&local_90,iVar14);
                                      std::operator+(&local_50,&local_f8,&local_90);
                                      plVar8 = (long *)std::__cxx11::string::append
                                                                 ((char *)&local_50);
                                      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                                      psVar10 = (size_type *)(plVar8 + 2);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)*plVar8 ==
                                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)psVar10) {
                                        local_138.field_2._M_allocated_capacity = *psVar10;
                                        local_138.field_2._8_8_ = plVar8[3];
                                      }
                                      else {
                                        local_138.field_2._M_allocated_capacity = *psVar10;
                                        local_138._M_dataplus._M_p = (pointer)*plVar8;
                                      }
                                      local_138._M_string_length = plVar8[1];
                                      *plVar8 = (long)psVar10;
                                      plVar8[1] = 0;
                                      *(undefined1 *)(plVar8 + 2) = 0;
                                      std::__cxx11::to_string(&local_b0,value);
                                      std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_160,&local_138,&local_b0);
                                      puVar9 = (undefined8 *)std::__cxx11::string::append(local_160)
                                      ;
                                      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                                      psVar10 = puVar9 + 2;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)*puVar9 ==
                                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)psVar10) {
                                        local_1a8.field_2._M_allocated_capacity = *psVar10;
                                        local_1a8.field_2._8_8_ = puVar9[3];
                                      }
                                      else {
                                        local_1a8.field_2._M_allocated_capacity = *psVar10;
                                        local_1a8._M_dataplus._M_p = (pointer)*puVar9;
                                      }
                                      local_1a8._M_string_length = puVar9[1];
                                      *puVar9 = psVar10;
                                      puVar9[1] = 0;
                                      *(undefined1 *)(puVar9 + 2) = 0;
                                      if (local_160 != (undefined1  [8])local_150) {
                                        operator_delete((void *)local_160,local_150._0_8_ + 1);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                                        operator_delete(local_b0._M_dataplus._M_p,
                                                        local_b0.field_2._M_allocated_capacity + 1);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_138._M_dataplus._M_p != &local_138.field_2) {
                                        operator_delete(local_138._M_dataplus._M_p,
                                                        local_138.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_50._M_dataplus._M_p != &local_50.field_2) {
                                        operator_delete(local_50._M_dataplus._M_p,
                                                        local_50.field_2._M_allocated_capacity + 1);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_90._M_dataplus._M_p != &local_90.field_2) {
                                        operator_delete(local_90._M_dataplus._M_p,
                                                        local_90.field_2._M_allocated_capacity + 1);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                                        operator_delete(local_f8._M_dataplus._M_p,
                                                        local_f8.field_2._M_allocated_capacity + 1);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_70._M_dataplus._M_p != &local_70.field_2) {
                                        operator_delete(local_70._M_dataplus._M_p,
                                                        local_70.field_2._M_allocated_capacity + 1);
                                      }
                                      Result::Result((Result *)local_160,INVALID_MODEL_PARAMETERS,
                                                     &local_1a8);
                                    }
                                    else {
                                      if (local_114 != QUINT) {
                                        std::operator+(&local_138,"Layer ",(layer->name_).ptr_);
                                        puVar9 = (undefined8 *)
                                                 std::__cxx11::string::append((char *)&local_138);
                                        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                                        psVar10 = puVar9 + 2;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)*puVar9 ==
                                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)psVar10) {
                                          local_1a8.field_2._M_allocated_capacity = *psVar10;
                                          local_1a8.field_2._8_8_ = puVar9[3];
                                        }
                                        else {
                                          local_1a8.field_2._M_allocated_capacity = *psVar10;
                                          local_1a8._M_dataplus._M_p = (pointer)*puVar9;
                                        }
                                        local_1a8._M_string_length = puVar9[1];
                                        *puVar9 = psVar10;
                                        puVar9[1] = 0;
                                        *(undefined1 *)(puVar9 + 2) = 0;
                                        Result::Result((Result *)local_160,INVALID_MODEL_PARAMETERS,
                                                       &local_1a8);
                                        local_188 = (
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_160;
                                        std::__cxx11::string::operator=
                                                  ((string *)&local_180,(string *)&local_158);
                                        if (local_158._M_p != local_150 + 8) {
                                          operator_delete(local_158._M_p,local_150._8_8_ + 1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                          operator_delete(local_1a8._M_dataplus._M_p,
                                                          local_1a8.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        goto LAB_00522188;
                                      }
                                      std::operator+(&local_138,"Layer \'",(layer->name_).ptr_);
                                      puVar9 = (undefined8 *)
                                               std::__cxx11::string::append((char *)&local_138);
                                      psVar10 = puVar9 + 2;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)*puVar9 ==
                                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)psVar10) {
                                        local_150._0_8_ = *psVar10;
                                        local_150._8_8_ = puVar9[3];
                                        local_160 = (undefined1  [8])local_150;
                                      }
                                      else {
                                        local_150._0_8_ = *psVar10;
                                        local_160 = (undefined1  [8])*puVar9;
                                      }
                                      local_158._M_p = (pointer)puVar9[1];
                                      *puVar9 = psVar10;
                                      puVar9[1] = 0;
                                      *(undefined1 *)(puVar9 + 2) = 0;
                                      puVar9 = (undefined8 *)std::__cxx11::string::append(local_160)
                                      ;
                                      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                                      psVar10 = puVar9 + 2;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)*puVar9 ==
                                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)psVar10) {
                                        local_1a8.field_2._M_allocated_capacity = *psVar10;
                                        local_1a8.field_2._8_8_ = puVar9[3];
                                      }
                                      else {
                                        local_1a8.field_2._M_allocated_capacity = *psVar10;
                                        local_1a8._M_dataplus._M_p = (pointer)*puVar9;
                                      }
                                      local_1a8._M_string_length = puVar9[1];
                                      *puVar9 = psVar10;
                                      puVar9[1] = 0;
                                      *(undefined1 *)(puVar9 + 2) = 0;
                                      if (local_160 != (undefined1  [8])local_150) {
                                        operator_delete((void *)local_160,local_150._0_8_ + 1);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_138._M_dataplus._M_p != &local_138.field_2) {
                                        operator_delete(local_138._M_dataplus._M_p,
                                                        local_138.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      Result::Result((Result *)local_160,INVALID_MODEL_PARAMETERS,
                                                     &local_1a8);
                                    }
                                  }
LAB_00521f99:
                                  local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_160;
                                  std::__cxx11::string::operator=
                                            ((string *)&local_180,(string *)&local_158);
                                  if (local_158._M_p != local_150 + 8) {
                                    operator_delete(local_158._M_p,local_150._8_8_ + 1);
                                  }
                                  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    **)__return_storage_ptr__ = local_188;
                                  paVar1 = &(__return_storage_ptr__->m_message).field_2;
                                  (__return_storage_ptr__->m_message)._M_dataplus._M_p =
                                       (pointer)paVar1;
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_180._M_p == &local_170) {
                                    paVar1->_M_allocated_capacity =
                                         CONCAT71(local_170._M_allocated_capacity._1_7_,
                                                  local_170._M_local_buf[0]);
                                    *(undefined8 *)
                                     ((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
                                         local_170._8_8_;
                                  }
                                  else {
                                    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
                                         local_180._M_p;
                                    (__return_storage_ptr__->m_message).field_2.
                                    _M_allocated_capacity =
                                         CONCAT71(local_170._M_allocated_capacity._1_7_,
                                                  local_170._M_local_buf[0]);
                                  }
                                  (__return_storage_ptr__->m_message)._M_string_length = local_178;
                                  local_178 = 0;
                                  local_170._M_local_buf[0] = '\0';
                                  uVar11 = local_1a8.field_2._M_allocated_capacity;
                                  _Var13._M_p = local_1a8._M_dataplus._M_p;
                                  local_180._M_p = (pointer)&local_170;
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_1a8._M_dataplus._M_p == &local_1a8.field_2)
                                  goto LAB_00522634;
                                }
                                operator_delete(_Var13._M_p,uVar11 + 1);
                                goto LAB_00522634;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_005225e6:
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)__return_storage_ptr__ = local_188;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p == &local_170) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_170._M_allocated_capacity._1_7_,local_170._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_170._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_180._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_170._M_allocated_capacity._1_7_,local_170._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_178;
  local_178 = 0;
  local_170._M_local_buf[0] = '\0';
  local_180._M_p = (pointer)&local_170;
LAB_00522634:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &local_170) {
    operator_delete(local_180._M_p,
                    CONCAT71(local_170._M_allocated_capacity._1_7_,local_170._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConvolution3DLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    r = validateInputCount(layer, 1, 1);
    if (!r.good()) { return r; }

    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) { return r; }

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Convolution3D", blobNameToRank);
        if (!r.good()) { return r; }
        r = validateRankCount(layer, "Convolution3D", 5, -1, blobNameToRank);
        if (!r.good()) { return r; }
    }

    const auto& params = layer.convolution3d();

    if (layer.input_size() != 1) {
        std::string err = "Convolution3D layer: '" + layer.name() +
            "', convolution3D does not support weight as input tensor.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Validate input and output channels and number of convolution groups are positive
    int inputChannels = params.inputchannels();
    int outputChannels = params.outputchannels();
    int nGroups = params.ngroups();
    r = validatePositive(inputChannels, "Input Channels");
    if (!r.good()) { return r; }
    r = validatePositive(outputChannels, "Output Channels");
    if (!r.good()) { return r; }
    r = validatePositive(nGroups, "Groups");
    if (!r.good()) { return r; }

    // Validate kernel is positive
    int kernelDepth = params.kerneldepth();
    int kernelHeight = params.kernelheight();
    int kernelWidth = params.kernelwidth();
    r = validatePositive(kernelDepth, "Kernel Depth");
    if (!r.good()) { return r; }
    r = validatePositive(kernelHeight, "Kernel Height");
    if (!r.good()) { return r; }
    r = validatePositive(kernelWidth, "Kernel Width");
    if (!r.good()) { return r; }

    // Validate stride is positive
    r = validatePositive(params.stridedepth(), "Stride Depth");
    if (!r.good()) { return r; }
    r = validatePositive(params.strideheight(), "Stride Height");
    if (!r.good()) { return r; }
    r = validatePositive(params.stridewidth(), "Stride Width");
    if (!r.good()) { return r; }

    // Validate dilation is positive
    r = validatePositive(params.dilationdepth(), "Dilation Depth");
    if (!r.good()) { return r; }
    r = validatePositive(params.dilationheight(), "Dilation Height");
    if (!r.good()) { return r; }
    r = validatePositive(params.dilationwidth(), "Dilation Width");
    if (!r.good()) { return r; }

    // Validate padding
    int customPaddingFront = params.custompaddingfront();
    int customPaddingBack = params.custompaddingback();
    int customPaddingTop = params.custompaddingtop();
    int customPaddingBottom = params.custompaddingbottom();
    int customPaddingLeft = params.custompaddingleft();
    int customPaddingRight = params.custompaddingright();
    if (customPaddingFront < 0) {
        std::string err = "Custom Padding Front must be non-negative, got '" +
            std::to_string(customPaddingFront) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingBack < 0) {
        std::string err = "Custom Padding Back must be non-negative, got '" +
            std::to_string(customPaddingBack) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingTop < 0) {
        std::string err = "Custom Padding Top must be non-negative, got '" +
            std::to_string(customPaddingTop) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingBottom < 0) {
        std::string err = "Custom Padding Bottom must be non-negative, got '" +
            std::to_string(customPaddingBottom) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingLeft < 0) {
        std::string err = "customPadding Left must be non-negative, got '" +
            std::to_string(customPaddingLeft) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingRight < 0) {
        std::string err = "customPadding Right must be non-negative, got '" +
            std::to_string(customPaddingRight) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(params.weights());
    biasValueType = valueType(params.bias());
    bool has_bias = params.hasbias();

    // Check weight/bias value types. Only float32 or float16 parameters can be populated at any time
    if ((weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)) {
        std::string err = "Convolution3D layer '" + layer.name() +
            "'  has invalid weights/bias fields.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)) {
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Convolution3D layer '" + layer.name() +
                "' has unmatched precisions of weights/bias They should either be half or full precision.");
            return r;
        }
    }

    bool is_deconv = params.isdeconvolution();

    if (params.outputshape_size() != 0) {
        if (!is_deconv) {
            std::string err = "Deconvolution3D Layer '" + layer.name() + "' Output Shape is supported for Deconvolution layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        } else if (params.outputshape_size() != 3) {
            std::string err = "Deconvolution3D layer: '" + layer.name() + "' , if set, output shape must be of length 3.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    // Manually check if weights are quantized--we don't currently support them and
    // `validateGeneralWeightParams` allows them
    if (weightsValueType == QUINT) {
        std::string err = "Layer '" + layer.name() + "' has invalid weights field. Quantized " +
            "weights are not supported.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    uint64_t expected_weight_size = 0;
    if (is_deconv) {
        expected_weight_size = static_cast<uint64_t>((outputChannels / nGroups) * inputChannels * kernelDepth * kernelHeight * kernelWidth);
    } else {
        expected_weight_size = static_cast<uint64_t>(outputChannels * (inputChannels / nGroups) * kernelDepth * kernelHeight * kernelWidth);
    }
    r = validateGeneralWeightParams(params.weights(), expected_weight_size, uint64_t(outputChannels),
                                    "Convolution3D ", layer.name(), "weights");
    if (!r.good()) { return r; }

    // Check the bias
    int bias_size = 0;
    if (has_bias) {
        if (biasValueType == FLOAT32 || biasValueType == FLOAT16){
            if (biasValueType == FLOAT32){
                bias_size = params.bias().floatvalue().size();
            } else {
                bias_size = int(params.bias().float16value().size() / 2);
            }
            if (bias_size != outputChannels) {
                std::string err = "Convolution3D layer '" + layer.name() +
                    "' has a bias vector of size " + std::to_string(bias_size) + " but should be " +
                    std::to_string(outputChannels) + ".";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
        } else if (biasValueType == QUINT){
            // We don't currently support quantized parameters.
            std::string err = "Layer '" + layer.name() + "' has invalid bias field. Quantized " +
                "bias is not supported.";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        } else { // EMPTY
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer " + layer.name() +
                "has not specified bias.");
            return r;
        }
    }
    return r;
}